

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O3

QGraphicsLayoutItem * __thiscall
QGraphicsLinearLayout::itemAt(QGraphicsLinearLayout *this,int index)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  int iVar2;
  long lVar3;
  QGraphicsLayoutItem *pQVar4;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < index) {
    pQVar1 = (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
    iVar2 = QGridLayoutEngine::itemCount();
    if (index < iVar2) {
      lVar3 = QGridLayoutEngine::itemAt((int)pQVar1 + 0x118);
      if (lVar3 == 0) {
        pQVar4 = (QGraphicsLayoutItem *)0x0;
      }
      else {
        pQVar4 = *(QGraphicsLayoutItem **)(lVar3 + 0x28);
      }
      goto LAB_005f74e6;
    }
  }
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_20 = "default";
  pQVar4 = (QGraphicsLayoutItem *)0x0;
  QMessageLogger::warning(local_38,"QGraphicsLinearLayout::itemAt: invalid index %d",index);
LAB_005f74e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsLayoutItem *QGraphicsLinearLayout::itemAt(int index) const
{
    Q_D(const QGraphicsLinearLayout);
    if (index < 0 || index >= d->engine.itemCount()) {
        qWarning("QGraphicsLinearLayout::itemAt: invalid index %d", index);
        return nullptr;
    }
    QGraphicsLayoutItem *item = nullptr;
    if (QGraphicsGridLayoutEngineItem *gridItem = static_cast<QGraphicsGridLayoutEngineItem *>(d->engine.itemAt(index)))
        item = gridItem->layoutItem();
    return item;
}